

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::alloc
          (array<CGlyphIndex,_allocator_default<CGlyphIndex>_> *this,int new_len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  CGlyphIndex *pCVar6;
  ulong uVar7;
  ulong uVar8;
  
  this->list_size = new_len;
  pCVar6 = allocator_default<CGlyphIndex>::alloc_array(new_len);
  uVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar3 = this->num_elements;
  }
  uVar8 = 0;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
    puVar1 = (undefined8 *)((long)&this->list->m_FontSizeIndex + uVar8);
    uVar4 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pCVar6->m_FontSizeIndex + uVar8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
  }
  allocator_default<CGlyphIndex>::free_array(this->list);
  iVar5 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar5 = this->num_elements;
  }
  this->num_elements = iVar5;
  this->list = pCVar6;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}